

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O2

void do_circle_stab(CHAR_DATA *ch,char *argument)

{
  ushort uVar1;
  CHAR_DATA *pCVar2;
  int iVar3;
  CHAR_DATA *victim;
  CHAR_DATA **ppCVar4;
  OBJ_DATA *pOVar5;
  int iVar6;
  char *txt;
  char arg [4608];
  
  one_argument(argument,arg);
  iVar3 = get_skill(ch,(int)gsn_circle);
  if (iVar3 < 2) {
    txt = "Circling? What\'s that?\n\r";
    goto LAB_0038fda4;
  }
  if (arg[0] == '\0') {
    victim = ch->fighting;
    if (victim == (CHAR_DATA *)0x0) {
      txt = "But you aren\'t fighting anyone.\n\r";
      goto LAB_0038fda4;
    }
  }
  else {
    victim = get_char_room(ch,arg);
    if (victim == (CHAR_DATA *)0x0) {
      txt = "They aren\'t here.\n\r";
      goto LAB_0038fda4;
    }
    if (ch->fighting == (CHAR_DATA *)0x0) {
      txt = "You can\'t circle someone like that.\n\r";
      goto LAB_0038fda4;
    }
  }
  ppCVar4 = &ch->in_room->people;
  do {
    pCVar2 = *ppCVar4;
    if (pCVar2 == (CHAR_DATA *)0x0) {
      if (victim == ch) {
        txt = "huh?\n\r";
      }
      else {
        pOVar5 = get_eq_char(ch,0x10);
        if (((pOVar5 != (OBJ_DATA *)0x0) && (pOVar5->value[0] == 2)) ||
           ((pOVar5 = get_eq_char(ch,0x12), pOVar5 != (OBJ_DATA *)0x0 && (pOVar5->value[0] == 2))))
        {
          iVar6 = (iVar3 + ch->level) - (int)victim->level;
          iVar3 = 0x5f;
          if (iVar6 < 0x5f) {
            iVar3 = iVar6;
          }
          iVar6 = 5;
          if (5 < iVar3) {
            iVar6 = iVar3;
          }
          WAIT_STATE(ch,(int)skill_table[gsn_circle].beats);
          iVar3 = number_percent();
          if (iVar3 < iVar6) {
            act("You circle around $N to land a critical strike.",ch,(void *)0x0,victim,3);
            act("$n circles around you to land a critical strike.",ch,(void *)0x0,victim,2);
            act("$n circles $N to land a critical strike.",ch,(void *)0x0,victim,1);
            check_improve(ch,(int)gsn_circle,true,1);
            iVar6 = dice(pOVar5->value[1],pOVar5->value[2]);
            iVar6 = iVar6 + 0x28;
            uVar1 = ch->level;
            if (0x14 < (short)uVar1) {
              if (((uVar1 < 0x19) || (uVar1 < 0x1e)) || (uVar1 < 0x28)) {
                iVar6 = iVar6 * 2;
              }
              else {
                iVar6 = iVar6 * 3;
              }
            }
            iVar3 = attack_table.super__Vector_base<attack_type,_std::allocator<attack_type>_>.
                    _M_impl.super__Vector_impl_data._M_start[pOVar5->value[3]].damage;
          }
          else {
            check_improve(ch,(int)gsn_circle,false,1);
            iVar6 = 0;
            iVar3 = 0;
          }
          damage_old(ch,victim,iVar6,(int)gsn_circle,iVar3,true);
          return;
        }
        txt = "You must wield a dagger to circle stab.\n\r";
      }
      goto LAB_0038fda4;
    }
    ppCVar4 = &pCVar2->next_in_room;
  } while (pCVar2->fighting != ch);
  txt = "Not while you\'re defending yourself!\n\r";
LAB_0038fda4:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_circle_stab(CHAR_DATA *ch, char *argument)
{
	bool attempt_dual;
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	CHAR_DATA *v_check;
	CHAR_DATA *v_next;
	OBJ_DATA *obj;
	int chance;
	int dam;

	attempt_dual = false;
	one_argument(argument, arg);

	chance = get_skill(ch, gsn_circle);

	if (chance <= 1)
	{
		send_to_char("Circling? What's that?\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		victim = ch->fighting;

		if (victim == nullptr)
		{
			send_to_char("But you aren't fighting anyone.\n\r", ch);
			return;
		}
	}
	else if ((victim = get_char_room(ch, arg)) == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch->fighting == nullptr)
	{
		send_to_char("You can't circle someone like that.\n\r", ch);
		return;
	}

	for (v_check = ch->in_room->people; v_check != nullptr; v_check = v_next)
	{
		v_next = v_check->next_in_room;

		if (v_check->fighting == ch)
		{
			send_to_char("Not while you're defending yourself!\n\r", ch);
			return;
		}
	}

	if (victim == ch)
	{
		send_to_char("huh?\n\r", ch);
		return;
	}

	obj = get_eq_char(ch, WEAR_WIELD);

	if (obj == nullptr || obj->value[0] != WEAPON_DAGGER)
	{
		attempt_dual = true;
		obj = get_eq_char(ch, WEAR_DUAL_WIELD);
	}

	if (obj == nullptr)
	{
		send_to_char("You must wield a dagger to circle stab.\n\r", ch);
		return;
	}

	if (obj->value[0] != 2)
	{
		send_to_char("You must wield a dagger to circle stab.\n\r", ch);
		return;
	}

	chance += (ch->level - victim->level);
	chance = URANGE(5, chance, 95);

	WAIT_STATE(ch, skill_table[gsn_circle].beats);

	if (number_percent() < chance)
	{
		act("You circle around $N to land a critical strike.", ch, nullptr, victim, TO_CHAR);
		act("$n circles around you to land a critical strike.", ch, nullptr, victim, TO_VICT);
		act("$n circles $N to land a critical strike.", ch, nullptr, victim, TO_NOTVICT);

		check_improve(ch, gsn_circle, true, 1);

		dam = dice(obj->value[1], obj->value[2]);
		dam += 40;

		if (ch->level <= 15)
			dam *= 1;
		else if (ch->level <= 20)
			dam *= 3 / 2;
		else if (ch->level < 25)
			dam *= 2;
		else if (ch->level < 30)
			dam *= 7 / 3;
		else if (ch->level < 40)
			dam *= 5 / 2;
		else if (ch->level <= 49)
			dam *= 7 / 2;
		else if (ch->level <= 55)
			dam *= 10 / 3;
		else
			dam *= 10 / 3;

		damage_old(ch, victim, dam, gsn_circle, attack_table[obj->value[3]].damage, true);
	}
	else
	{
		check_improve(ch, gsn_circle, false, 1);
		damage_old(ch, victim, 0, gsn_circle, DAM_NONE, true);
	}
}